

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_1::FillRuleCase::iterate(FillRuleCase *this)

{
  RGBA RVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  TestLog *pTVar6;
  PixelFormat *pPVar7;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  size_type __n;
  MessageBuilder *pMVar9;
  int iVar10;
  bool bVar11;
  allocator<char> local_ed9;
  string local_ed8;
  allocator<char> local_eb1;
  string local_eb0;
  LogImage local_e90;
  allocator<char> local_df9;
  string local_df8;
  allocator<char> local_dd1;
  string local_dd0;
  LogImageSet local_db0;
  MessageBuilder local_d70;
  MessageBuilder local_bf0;
  RGBA local_a6c;
  int local_a68;
  RGBA color_1;
  int x_1;
  int y_1;
  byte local_8da;
  allocator<char> local_8d9;
  undefined1 local_8d8 [6];
  bool missingFragments;
  allocator<char> local_8b1;
  string local_8b0;
  LogImage local_890;
  allocator<char> local_7f9;
  string local_7f8;
  allocator<char> local_7d1;
  string local_7d0;
  LogImageSet local_7b0;
  MessageBuilder local_770;
  MessageBuilder local_5f0;
  RGBA local_46c;
  int local_468;
  RGBA color;
  int x;
  int y;
  byte local_2dd;
  RGBA local_2dc;
  undefined1 local_2d8 [3];
  bool overdraw;
  RGBA triangleColor;
  allocator<tcu::Vector<float,_4>_> local_151;
  Vector<float,_4> local_150;
  undefined1 local_140 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colorBuffer;
  Functions *gl;
  undefined1 local_118 [7];
  bool imageShown;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  Surface resultImage;
  int thresholdBlue;
  int thresholdGreen;
  int thresholdRed;
  ScopedLogSection section;
  int local_9c;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string iterationDescription;
  FillRuleCase *this_local;
  
  local_9c = this->m_iteration + 1;
  iterationDescription.field_2._8_8_ = this;
  de::toString<int>(&local_98,&local_9c);
  std::operator+(&local_78,"Test iteration ",&local_98);
  std::operator+(&local_58,&local_78," / ");
  de::toString<int>((string *)&section,&this->m_iterationCount);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section);
  std::__cxx11::string::~string((string *)&section);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  pTVar6 = tcu::TestContext::getLog
                     ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&thresholdGreen,pTVar6,(string *)local_38,(string *)local_38);
  pPVar7 = BaseRenderingCase::getPixelFormat(&this->super_BaseRenderingCase);
  iVar2 = 1 << (8U - (char)pPVar7->redBits & 0x1f);
  pPVar7 = BaseRenderingCase::getPixelFormat(&this->super_BaseRenderingCase);
  iVar3 = 1 << (8U - (char)pPVar7->greenBits & 0x1f);
  pPVar7 = BaseRenderingCase::getPixelFormat(&this->super_BaseRenderingCase);
  iVar10 = 1 << (8U - (char)pPVar7->blueBits & 0x1f);
  iVar4 = (this->super_BaseRenderingCase).m_renderSize;
  tcu::Surface::Surface
            ((Surface *)
             &drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,iVar4,iVar4);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_118);
  generateTriangles(this,this->m_iteration,
                    (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                    local_118);
  pRVar8 = gles3::Context::getRenderContext
                     ((this->super_BaseRenderingCase).super_TestCase.m_context);
  iVar4 = (*pRVar8->_vptr_RenderContext[3])();
  colorBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar4);
  __n = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                  ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                   local_118);
  tcu::Vector<float,_4>::Vector(&local_150,0.5,0.5,0.5,1.0);
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_151);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_140,__n
             ,&local_150,&local_151);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_151);
  pTVar6 = tcu::TestContext::getLog
                     ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_2d8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar9 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_2d8,
                      (char (*) [102])
                      "Drawing gray triangles with shared edges.\nEnabling additive blending to detect overlapping fragments."
                     );
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_2d8);
  (**(code **)colorBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage[0x5e].m_data)(0xbe2);
  (**(code **)colorBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage[0x10].m_data)(0x8006);
  (**(code **)colorBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage[0x12].m_data)(1);
  BaseRenderingCase::drawPrimitives
            (&this->super_BaseRenderingCase,
             (Surface *)
             &drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_118,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_140,4);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_140);
  tcu::RGBA::RGBA(&local_2dc,0x7f,0x7f,0x7f,0xff);
  local_2dd = 0;
  pTVar6 = tcu::TestContext::getLog
                     ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  tcu::TestLog::operator<<((MessageBuilder *)&x,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar9 = tcu::MessageBuilder::operator<<((MessageBuilder *)&x,(char (*) [18])"Verifying result.");
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&x);
  color.m_value = 0;
  do {
    RVar1.m_value = color.m_value;
    iVar4 = tcu::Surface::getHeight
                      ((Surface *)
                       &drawBuffer.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (iVar4 <= (int)RVar1.m_value) {
      bVar11 = (local_2dd & 1) != 0;
      if (bVar11) {
        pTVar6 = tcu::TestContext::getLog
                           ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_770,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<
                           (&local_770,
                            (char (*) [52])"Overlapping fragments detected, image is not valid.");
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_770);
        pTVar6 = tcu::TestContext::getLog
                           ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7d0,"Result of rendering",&local_7d1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7f8,"Result of rendering",&local_7f9);
        tcu::LogImageSet::LogImageSet(&local_7b0,&local_7d0,&local_7f8);
        pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_7b0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_8b0,"Result",&local_8b1)
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_8d8,"Result",&local_8d9);
        tcu::LogImage::LogImage
                  (&local_890,&local_8b0,(string *)local_8d8,
                   (Surface *)
                   &drawBuffer.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_890);
        tcu::TestLog::operator<<(pTVar6,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
        tcu::LogImage::~LogImage(&local_890);
        std::__cxx11::string::~string((string *)local_8d8);
        std::allocator<char>::~allocator(&local_8d9);
        std::__cxx11::string::~string((string *)&local_8b0);
        std::allocator<char>::~allocator(&local_8b1);
        tcu::LogImageSet::~LogImageSet(&local_7b0);
        std::__cxx11::string::~string((string *)&local_7f8);
        std::allocator<char>::~allocator(&local_7f9);
        std::__cxx11::string::~string((string *)&local_7d0);
        std::allocator<char>::~allocator(&local_7d1);
        this->m_allIterationsPassed = false;
      }
      else {
        pTVar6 = tcu::TestContext::getLog
                           ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_5f0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<
                           (&local_5f0,(char (*) [35])"No overlapping fragments detected.");
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_5f0);
      }
      if (*(int *)&(this->super_BaseRenderingCase).field_0xc4 == 2) {
        local_8da = 0;
        pTVar6 = tcu::TestContext::getLog
                           ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)&x_1,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)&x_1,(char (*) [29])"Searching missing fragments.");
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&x_1);
        for (color_1.m_value = 0; RVar1.m_value = color_1.m_value,
            iVar4 = tcu::Surface::getHeight
                              ((Surface *)
                               &drawBuffer.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage),
            (int)RVar1.m_value < iVar4; color_1.m_value = color_1.m_value + 1) {
          for (local_a68 = 0; iVar4 = local_a68,
              iVar5 = tcu::Surface::getWidth
                                ((Surface *)
                                 &drawBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage), iVar4 < iVar5
              ; local_a68 = local_a68 + 1) {
            local_a6c = tcu::Surface::getPixel
                                  ((Surface *)
                                   &drawBuffer.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,local_a68,
                                   color_1.m_value);
            iVar4 = tcu::RGBA::getRed(&local_a6c);
            if (((iVar4 <= iVar2) || (iVar4 = tcu::RGBA::getGreen(&local_a6c), iVar4 <= iVar3)) ||
               (iVar4 = tcu::RGBA::getBlue(&local_a6c), iVar4 <= iVar10)) {
              local_8da = 1;
            }
          }
        }
        if ((local_8da & 1) == 0) {
          pTVar6 = tcu::TestContext::getLog
                             ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.
                              super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_bf0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar9 = tcu::MessageBuilder::operator<<
                             (&local_bf0,(char (*) [31])"No missing fragments detected.");
          tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_bf0);
        }
        else {
          pTVar6 = tcu::TestContext::getLog
                             ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.
                              super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_d70,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar9 = tcu::MessageBuilder::operator<<
                             (&local_d70,
                              (char (*) [48])"Missing fragments detected, image is not valid.");
          tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_d70);
          if (!bVar11) {
            pTVar6 = tcu::TestContext::getLog
                               ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.
                                super_TestNode.m_testCtx);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_dd0,"Result of rendering",&local_dd1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_df8,"Result of rendering",&local_df9);
            tcu::LogImageSet::LogImageSet(&local_db0,&local_dd0,&local_df8);
            pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_db0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_eb0,"Result",&local_eb1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_ed8,"Result",&local_ed9);
            tcu::LogImage::LogImage
                      (&local_e90,&local_eb0,&local_ed8,
                       (Surface *)
                       &drawBuffer.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
            pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_e90);
            tcu::TestLog::operator<<(pTVar6,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
            tcu::LogImage::~LogImage(&local_e90);
            std::__cxx11::string::~string((string *)&local_ed8);
            std::allocator<char>::~allocator(&local_ed9);
            std::__cxx11::string::~string((string *)&local_eb0);
            std::allocator<char>::~allocator(&local_eb1);
            tcu::LogImageSet::~LogImageSet(&local_db0);
            std::__cxx11::string::~string((string *)&local_df8);
            std::allocator<char>::~allocator(&local_df9);
            std::__cxx11::string::~string((string *)&local_dd0);
            std::allocator<char>::~allocator(&local_dd1);
          }
          this->m_allIterationsPassed = false;
        }
      }
      iVar4 = this->m_iteration + 1;
      this->m_iteration = iVar4;
      if (iVar4 == this->m_iterationCount) {
        if ((this->m_allIterationsPassed & 1U) == 0) {
          tcu::TestContext::setTestResult
                    ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx,QP_TEST_RESULT_FAIL,"Found invalid pixels");
        }
        else {
          tcu::TestContext::setTestResult
                    ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx,QP_TEST_RESULT_PASS,"Pass");
        }
        this_local._4_4_ = STOP;
      }
      else {
        this_local._4_4_ = CONTINUE;
      }
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_118
                );
      tcu::Surface::~Surface
                ((Surface *)
                 &drawBuffer.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      tcu::ScopedLogSection::~ScopedLogSection((ScopedLogSection *)&thresholdGreen);
      std::__cxx11::string::~string((string *)local_38);
      return this_local._4_4_;
    }
    for (local_468 = 0; iVar4 = local_468,
        iVar5 = tcu::Surface::getWidth
                          ((Surface *)
                           &drawBuffer.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage), iVar4 < iVar5;
        local_468 = local_468 + 1) {
      local_46c = tcu::Surface::getPixel
                            ((Surface *)
                             &drawBuffer.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,local_468,
                             color.m_value);
      iVar4 = tcu::RGBA::getRed(&local_46c);
      iVar5 = tcu::RGBA::getRed(&local_2dc);
      if (iVar2 < iVar4 - iVar5) {
LAB_01b2f443:
        local_2dd = 1;
      }
      else {
        iVar4 = tcu::RGBA::getGreen(&local_46c);
        iVar5 = tcu::RGBA::getGreen(&local_2dc);
        if (iVar3 < iVar4 - iVar5) goto LAB_01b2f443;
        iVar4 = tcu::RGBA::getBlue(&local_46c);
        iVar5 = tcu::RGBA::getBlue(&local_2dc);
        if (iVar10 < iVar4 - iVar5) goto LAB_01b2f443;
      }
    }
    color.m_value = color.m_value + 1;
  } while( true );
}

Assistant:

FillRuleCase::IterateResult FillRuleCase::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_testCtx.getLog(), iterationDescription, iterationDescription);
	const int								thresholdRed			= 1 << (8 - getPixelFormat().redBits);
	const int								thresholdGreen			= 1 << (8 - getPixelFormat().greenBits);
	const int								thresholdBlue			= 1 << (8 - getPixelFormat().blueBits);
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;
	bool									imageShown				= false;

	generateTriangles(m_iteration, drawBuffer);

	// draw image
	{
		const glw::Functions&			gl				= m_context.getRenderContext().getFunctions();
		const std::vector<tcu::Vec4>	colorBuffer		(drawBuffer.size(), tcu::Vec4(0.5f, 0.5f, 0.5f, 1.0f));

		m_testCtx.getLog() << tcu::TestLog::Message << "Drawing gray triangles with shared edges.\nEnabling additive blending to detect overlapping fragments." << tcu::TestLog::EndMessage;

		gl.enable(GL_BLEND);
		gl.blendEquation(GL_FUNC_ADD);
		gl.blendFunc(GL_ONE, GL_ONE);
		drawPrimitives(resultImage, drawBuffer, colorBuffer, GL_TRIANGLES);
	}

	// verify no overdraw
	{
		const tcu::RGBA	triangleColor	= tcu::RGBA(127, 127, 127, 255);
		bool			overdraw		= false;

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying result." << tcu::TestLog::EndMessage;

		for (int y = 0; y < resultImage.getHeight(); ++y)
		for (int x = 0; x < resultImage.getWidth();  ++x)
		{
			const tcu::RGBA color = resultImage.getPixel(x, y);

			// color values are greater than triangle color? Allow lower values for multisampled edges and background.
			if ((color.getRed()   - triangleColor.getRed())   > thresholdRed   ||
				(color.getGreen() - triangleColor.getGreen()) > thresholdGreen ||
				(color.getBlue()  - triangleColor.getBlue())  > thresholdBlue)
				overdraw = true;
		}

		// results
		if (!overdraw)
			m_testCtx.getLog() << tcu::TestLog::Message << "No overlapping fragments detected." << tcu::TestLog::EndMessage;
		else
		{
			m_testCtx.getLog()	<< tcu::TestLog::Message << "Overlapping fragments detected, image is not valid." << tcu::TestLog::EndMessage;
			m_testCtx.getLog()	<< tcu::TestLog::ImageSet("Result of rendering", "Result of rendering")
								<< tcu::TestLog::Image("Result", "Result", resultImage)
								<< tcu::TestLog::EndImageSet;

			imageShown = true;
			m_allIterationsPassed = false;
		}
	}

	// verify no missing fragments in the full viewport case
	if (m_caseType == FILLRULECASE_CLIPPED_FULL)
	{
		bool missingFragments = false;

		m_testCtx.getLog() << tcu::TestLog::Message << "Searching missing fragments." << tcu::TestLog::EndMessage;

		for (int y = 0; y < resultImage.getHeight(); ++y)
		for (int x = 0; x < resultImage.getWidth();  ++x)
		{
			const tcu::RGBA color = resultImage.getPixel(x, y);

			// black? (background)
			if (color.getRed()   <= thresholdRed   ||
				color.getGreen() <= thresholdGreen ||
				color.getBlue()  <= thresholdBlue)
				missingFragments = true;
		}

		// results
		if (!missingFragments)
			m_testCtx.getLog() << tcu::TestLog::Message << "No missing fragments detected." << tcu::TestLog::EndMessage;
		else
		{
			m_testCtx.getLog()	<< tcu::TestLog::Message << "Missing fragments detected, image is not valid." << tcu::TestLog::EndMessage;

			if (!imageShown)
			{
				m_testCtx.getLog()	<< tcu::TestLog::ImageSet("Result of rendering", "Result of rendering")
									<< tcu::TestLog::Image("Result", "Result", resultImage)
									<< tcu::TestLog::EndImageSet;
			}

			m_allIterationsPassed = false;
		}
	}

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Found invalid pixels");

		return STOP;
	}
	else
		return CONTINUE;
}